

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

char * __thiscall
google::protobuf::io::Printer::WriteVariable
          (Printer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *vars,char *format,int *arg_index,
          vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *annotations)

{
  ulong uVar1;
  int iVar2;
  pointer ppVar3;
  AnnotationCollector *pAVar4;
  pointer pbVar5;
  pointer pcVar6;
  undefined8 uVar7;
  int iVar8;
  LogMessage *pLVar9;
  long lVar10;
  const_iterator cVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  _Alloc_hider _Var13;
  char *pcVar14;
  undefined8 uVar15;
  long lVar16;
  int iVar17;
  LogMessage local_148;
  size_type *local_110;
  string sub;
  undefined1 local_b8 [16];
  _Alloc_hider local_a8;
  size_type local_98 [3];
  undefined1 local_80 [8];
  string var_name;
  LogFinisher local_31;
  
  var_name.field_2._8_8_ = strchr(format,0x24);
  if ((char *)var_name.field_2._8_8_ == (char *)0x0) {
    pLVar9 = (LogMessage *)((long)&sub.field_2 + 8);
    internal::LogMessage::LogMessage
              (pLVar9,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
               ,0x13a);
    pLVar9 = internal::LogMessage::operator<<(pLVar9," Unclosed variable name.");
    internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar9);
    internal::LogMessage::~LogMessage((LogMessage *)((long)&sub.field_2 + 8));
  }
  lVar16 = var_name.field_2._8_8_ - (long)format;
  if ((char *)var_name.field_2._8_8_ == format) {
    if (this->at_start_of_line_ == true) {
      CopyToBuffer(this,(this->indent_)._M_dataplus._M_p,(int)(this->indent_)._M_string_length);
      this->at_start_of_line_ = false;
    }
    push_back(this,'$');
  }
  else {
    if (*format == '{') {
      if ((int)format[1] - 0x3aU < 0xfffffff6) {
        pLVar9 = (LogMessage *)((long)&sub.field_2 + 8);
        internal::LogMessage::LogMessage
                  (pLVar9,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
                   ,0x144);
        pLVar9 = internal::LogMessage::operator<<(pLVar9,"CHECK failed: std::isdigit(start[1]): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar9);
        internal::LogMessage::~LogMessage((LogMessage *)((long)&sub.field_2 + 8));
      }
      if (lVar16 != 2) {
        internal::LogMessage::LogMessage
                  (&local_148,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
                   ,0x145);
        pLVar9 = internal::LogMessage::operator<<(&local_148,"CHECK failed: (end - start) == (2): ")
        ;
        internal::LogFinisher::operator=((LogFinisher *)local_b8,pLVar9);
        internal::LogMessage::~LogMessage(&local_148);
      }
      iVar8 = (int)format[1];
      uVar1 = (long)iVar8 - 0x31;
      if ((iVar8 < 0x31) ||
         ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= (uVar1 & 0xffffffff))) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
                   ,0x148);
        pLVar9 = internal::LogMessage::operator<<((LogMessage *)local_b8,"Annotation ${");
        pLVar9 = internal::LogMessage::operator<<(pLVar9,iVar8 + -0x30);
        pLVar9 = internal::LogMessage::operator<<(pLVar9,"$ is out of bounds.");
        internal::LogFinisher::operator=((LogFinisher *)local_80,pLVar9);
        internal::LogMessage::~LogMessage((LogMessage *)local_b8);
      }
      iVar2 = *arg_index;
      if (iVar2 < (int)uVar1) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
                   ,0x14b);
        pLVar9 = internal::LogMessage::operator<<
                           ((LogMessage *)local_b8,
                            "Annotation arg must be in correct order as given. Expected");
        pLVar9 = internal::LogMessage::operator<<(pLVar9," ${");
        pLVar9 = internal::LogMessage::operator<<(pLVar9,*arg_index + 1);
        pLVar9 = internal::LogMessage::operator<<(pLVar9,"$ got ${");
        pLVar9 = internal::LogMessage::operator<<(pLVar9,iVar8 + -0x30);
        pLVar9 = internal::LogMessage::operator<<(pLVar9,"$.");
        internal::LogFinisher::operator=((LogFinisher *)local_80,pLVar9);
        internal::LogMessage::~LogMessage((LogMessage *)local_b8);
      }
      else if ((int)uVar1 == iVar2) {
        *arg_index = iVar2 + 1;
      }
      if (this->at_start_of_line_ == true) {
        CopyToBuffer(this,(this->indent_)._M_dataplus._M_p,(int)(this->indent_)._M_string_length);
        this->at_start_of_line_ = false;
      }
      local_b8._0_8_ = this->offset_;
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_b8._8_8_ = (char *)0x0;
      pcVar6 = pbVar5[uVar1]._M_dataplus._M_p;
      local_a8._M_p = (pointer)local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar6,pcVar6 + pbVar5[uVar1]._M_string_length);
      std::
      vector<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>
                ((vector<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>>
                  *)annotations,
                 (pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_b8);
      _Var13._M_p = local_a8._M_p;
      if ((size_type *)local_a8._M_p == local_98) goto LAB_002e0675;
    }
    else {
      if (*format == '}') {
        if (annotations ==
            (vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x0) {
          pLVar9 = (LogMessage *)((long)&sub.field_2 + 8);
          internal::LogMessage::LogMessage
                    (pLVar9,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
                     ,0x154);
          pLVar9 = internal::LogMessage::operator<<(pLVar9,"CHECK failed: annotations: ");
          internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar9);
          internal::LogMessage::~LogMessage((LogMessage *)((long)&sub.field_2 + 8));
        }
        if ((annotations->
            super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start ==
            (annotations->
            super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          internal::LogMessage::LogMessage
                    (&local_148,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
                     ,0x156);
          pLVar9 = internal::LogMessage::operator<<
                             (&local_148,"Unexpected end of annotation found.");
          internal::LogFinisher::operator=((LogFinisher *)local_b8,pLVar9);
          internal::LogMessage::~LogMessage(&local_148);
        }
        ppVar3 = (annotations->
                 super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        ppVar3[-1].first.second = this->offset_;
        pAVar4 = this->annotation_collector_;
        if (pAVar4 != (AnnotationCollector *)0x0) {
          (**(code **)(*(long *)pAVar4 + 8))(pAVar4,ppVar3 + -1);
        }
        ppVar3 = (annotations->
                 super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (annotations->
        super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = ppVar3 + -1;
        paVar12 = &ppVar3[-1].second.field_2;
        _Var13._M_p = ppVar3[-1].second._M_dataplus._M_p;
      }
      else {
        uVar15 = format;
        pcVar14 = format;
        if (format < (ulong)var_name.field_2._8_8_) {
          do {
            uVar15 = pcVar14;
            if (*(char *)uVar15 != ' ') break;
            pcVar14 = (char *)(uVar15 + 1);
            uVar15 = var_name.field_2._8_8_;
          } while (pcVar14 != (char *)var_name.field_2._8_8_);
        }
        if (uVar15 == var_name.field_2._8_8_) {
          pLVar9 = (LogMessage *)((long)&sub.field_2 + 8);
          internal::LogMessage::LogMessage
                    (pLVar9,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
                     ,0x161);
          pLVar9 = internal::LogMessage::operator<<(pLVar9," Empty variable.");
          internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar9);
          internal::LogMessage::~LogMessage((LogMessage *)((long)&sub.field_2 + 8));
        }
        lVar16 = 0;
        uVar7 = var_name.field_2._8_8_;
        do {
          pcVar14 = (char *)uVar7;
          lVar10 = lVar16;
          if (pcVar14 <= (ulong)uVar15) break;
          lVar16 = lVar10 + 1;
          uVar7 = pcVar14 + -1;
        } while (pcVar14[-1] == ' ');
        local_80 = (undefined1  [8])&var_name._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_80,uVar15,var_name.field_2._8_8_ - lVar10);
        local_110 = &sub._M_string_length;
        sub._M_dataplus._M_p = (pointer)0x0;
        sub._M_string_length._0_1_ = 0;
        if ((int)*(char *)local_80 - 0x30U < 10) {
          if (var_name._M_dataplus._M_p != (pointer)0x1) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)((long)&sub.field_2 + 8),LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
                       ,0x169);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)((long)&sub.field_2 + 8),
                                "CHECK failed: (var_name.size()) == (1): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)((long)&sub.field_2 + 8));
          }
          iVar8 = (int)*(char *)local_80;
          if (iVar8 < 0x31) {
            internal::LogMessage::LogMessage
                      (&local_148,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
                       ,0x16b);
            pLVar9 = internal::LogMessage::operator<<(&local_148,"CHECK failed: (idx) >= (0): ");
            internal::LogFinisher::operator=((LogFinisher *)local_b8,pLVar9);
            internal::LogMessage::~LogMessage(&local_148);
          }
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) <= (long)iVar8 - 0x31U)
          {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
                       ,0x16d);
            pLVar9 = internal::LogMessage::operator<<((LogMessage *)local_b8,"Argument $");
            pLVar9 = internal::LogMessage::operator<<(pLVar9,iVar8 + -0x30);
            pLVar9 = internal::LogMessage::operator<<(pLVar9,"$ is out of bounds.");
            internal::LogFinisher::operator=(&local_31,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_b8);
          }
          iVar2 = *arg_index;
          iVar17 = (int)((long)iVar8 - 0x31U);
          if (iVar2 < iVar17) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
                       ,0x170);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_b8,
                                "Arguments must be used in same order as given. Expected $");
            pLVar9 = internal::LogMessage::operator<<(pLVar9,*arg_index + 1);
            pLVar9 = internal::LogMessage::operator<<(pLVar9,"$ got $");
            pLVar9 = internal::LogMessage::operator<<(pLVar9,iVar8 + -0x30);
            pLVar9 = internal::LogMessage::operator<<(pLVar9,"$.");
            internal::LogFinisher::operator=(&local_31,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_b8);
          }
          else if (iVar17 == iVar2) {
            *arg_index = iVar2 + 1;
          }
          std::__cxx11::string::_M_assign((string *)&local_110);
        }
        else {
          cVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&vars->_M_t,(key_type *)local_80);
          if ((_Rb_tree_header *)cVar11._M_node == &(vars->_M_t)._M_impl.super__Rb_tree_header) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)((long)&sub.field_2 + 8),LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/printer.cc"
                       ,0x179);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)((long)&sub.field_2 + 8)," Unknown variable: ");
            pLVar9 = internal::LogMessage::operator<<(pLVar9,(string *)local_80);
            pLVar9 = internal::LogMessage::operator<<(pLVar9,".");
            internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)((long)&sub.field_2 + 8));
          }
          std::__cxx11::string::_M_assign((string *)&local_110);
        }
        if (sub._M_dataplus._M_p != (pointer)0x0) {
          if (this->at_start_of_line_ == true) {
            CopyToBuffer(this,(this->indent_)._M_dataplus._M_p,(int)(this->indent_)._M_string_length
                        );
            this->at_start_of_line_ = false;
          }
          CopyToBuffer(this,format,(int)uVar15 - (int)format);
          CopyToBuffer(this,(char *)local_110,(int)sub._M_dataplus._M_p);
          CopyToBuffer(this,pcVar14,(int)lVar10);
        }
        if (local_110 != &sub._M_string_length) {
          operator_delete(local_110);
        }
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&var_name._M_string_length;
        _Var13._M_p = (pointer)local_80;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p == paVar12) goto LAB_002e0675;
    }
    operator_delete(_Var13._M_p);
  }
LAB_002e0675:
  return (char *)(var_name.field_2._8_8_ + 1);
}

Assistant:

const char* Printer::WriteVariable(
    const std::vector<string>& args,
    const std::map<std::string, std::string>& vars, const char* format,
    int* arg_index, std::vector<AnnotationCollector::Annotation>* annotations) {
  auto start = format;
  auto end = strchr(format, '$');
  if (!end) {
    GOOGLE_LOG(FATAL) << " Unclosed variable name.";
  }
  format = end + 1;
  if (end == start) {
    // "$$" is an escape for just '$'
    IndentIfAtStart();
    push_back('$');
    return format;
  }
  if (*start == '{') {
    GOOGLE_CHECK(std::isdigit(start[1]));
    GOOGLE_CHECK_EQ(end - start, 2);
    int idx = start[1] - '1';
    if (idx < 0 || idx >= args.size()) {
      GOOGLE_LOG(FATAL) << "Annotation ${" << idx + 1 << "$ is out of bounds.";
    }
    if (idx > *arg_index) {
      GOOGLE_LOG(FATAL) << "Annotation arg must be in correct order as given. Expected"
                 << " ${" << (*arg_index) + 1 << "$ got ${" << idx + 1 << "$.";
    } else if (idx == *arg_index) {
      (*arg_index)++;
    }
    IndentIfAtStart();
    annotations->push_back({{offset_, 0}, args[idx]});
    return format;
  } else if (*start == '}') {
    GOOGLE_CHECK(annotations);
    if (annotations->empty()) {
      GOOGLE_LOG(FATAL) << "Unexpected end of annotation found.";
    }
    auto& a = annotations->back();
    a.first.second = offset_;
    if (annotation_collector_) annotation_collector_->AddAnnotationNew(a);
    annotations->pop_back();
    return format;
  }
  auto start_var = start;
  while (start_var < end && *start_var == ' ') start_var++;
  if (start_var == end) {
    GOOGLE_LOG(FATAL) << " Empty variable.";
  }
  auto end_var = end;
  while (start_var < end_var && *(end_var - 1) == ' ') end_var--;
  std::string var_name{
      start_var, static_cast<std::string::size_type>(end_var - start_var)};
  std::string sub;
  if (std::isdigit(var_name[0])) {
    GOOGLE_CHECK_EQ(var_name.size(), 1);  // No need for multi-digits
    int idx = var_name[0] - '1';   // Start counting at 1
    GOOGLE_CHECK_GE(idx, 0);
    if (idx >= args.size()) {
      GOOGLE_LOG(FATAL) << "Argument $" << idx + 1 << "$ is out of bounds.";
    }
    if (idx > *arg_index) {
      GOOGLE_LOG(FATAL) << "Arguments must be used in same order as given. Expected $"
                 << (*arg_index) + 1 << "$ got $" << idx + 1 << "$.";
    } else if (idx == *arg_index) {
      (*arg_index)++;
    }
    sub = args[idx];
  } else {
    auto it = vars.find(var_name);
    if (it == vars.end()) {
      GOOGLE_LOG(FATAL) << " Unknown variable: " << var_name << ".";
    }
    sub = it->second;
  }

  // By returning here in case of empty we also skip possible spaces inside
  // the $...$, i.e. "void$ dllexpor$ f();" -> "void f();" in the empty case.
  if (sub.empty()) return format;

  // We're going to write something non-empty so we need a possible indent.
  IndentIfAtStart();

  // Write the possible spaces in front.
  CopyToBuffer(start, start_var - start);
  // Write a non-empty substituted variable.
  CopyToBuffer(sub.c_str(), sub.size());
  // Finish off with writing possible trailing spaces.
  CopyToBuffer(end_var, end - end_var);
  return format;
}